

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_points.cpp
# Opt level: O1

void __thiscall
Am_Drawonable_Impl::Get_Polygon_Bounding_Box
          (Am_Drawonable_Impl *this,Am_Point_List *pl,Am_Style *ls,int *out_left,int *out_top,
          int *width,int *height)

{
  ulong uVar1;
  bool bVar2;
  unsigned_short uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  int y;
  int x;
  short thick;
  double bx;
  int firsty;
  double by;
  int firstx;
  int nexty;
  int nextx;
  int th1;
  int th0;
  Am_Join_Style_Flag join;
  Am_Line_Cap_Style_Flag cap;
  int lastx;
  Am_Image_Array stipple;
  Am_Fill_Poly_Flag poly;
  Am_Fill_Solid_Flag fill;
  int dashl;
  Am_Line_Solid_Flag solid;
  char *dash;
  int local_104;
  int local_100;
  short local_fa;
  undefined8 local_f8;
  Am_Point_List local_f0;
  int local_e0;
  int local_dc;
  undefined8 local_d8;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  Am_Join_Style_Flag local_b4;
  Am_Line_Cap_Style_Flag local_b0;
  int local_ac;
  double local_a8;
  ulong uStack_a0;
  int *local_98;
  int *local_90;
  int *local_88;
  Am_Image_Array local_80;
  double local_78;
  ulong uStack_70;
  double local_68;
  double local_60;
  Am_Fill_Poly_Flag local_58;
  Am_Fill_Solid_Flag local_54;
  int local_50;
  Am_Line_Solid_Flag local_4c;
  double local_48;
  undefined8 uStack_40;
  char *local_38;
  
  local_98 = out_left;
  local_90 = out_top;
  local_88 = width;
  Am_Image_Array::Am_Image_Array(&local_80);
  Am_Style::Get_Values
            (ls,&local_fa,&local_b0,&local_b4,&local_4c,&local_38,&local_50,&local_54,&local_58,
             &local_80);
  if ((0 < local_fa) && (local_b4 == Am_JOIN_MITER)) {
    uVar3 = Am_Point_List::Length(pl);
    if (2 < uVar3) {
      Am_Point_List::Am_Point_List(&local_f0,pl);
      iVar5 = (int)local_fa;
      Am_Point_List::Start(&local_f0);
      Am_Point_List::Get(&local_f0,&local_cc,&local_dc);
      Am_Point_List::End(&local_f0);
      Am_Point_List::Get(&local_f0,&local_ac,&local_d0);
      if ((local_ac == local_cc) && (local_d0 == local_dc)) {
        Am_Point_List::Prev(&local_f0);
        Am_Point_List::Get(&local_f0,&local_100,&local_104);
        Am_Point_List::Start(&local_f0);
        next_vertex(&local_f0,local_100,local_104,&local_100,&local_104,(double *)&local_f8,
                    (double *)&local_d8);
        local_a8 = (double)CONCAT44(local_f8._4_4_,(int)local_f8);
        iVar7 = local_cc;
        iVar8 = local_dc;
        iVar9 = local_dc;
        iVar10 = local_cc;
      }
      else {
        iVar6 = iVar5 / 2;
        if (local_b0 == Am_CAP_PROJECTING) {
          iVar6 = iVar5;
        }
        iVar10 = local_ac - iVar6;
        if (local_cc - iVar6 < local_ac - iVar6) {
          iVar10 = local_cc - iVar6;
        }
        iVar7 = local_ac + iVar6;
        if (local_ac + iVar6 < local_cc + iVar6) {
          iVar7 = local_cc + iVar6;
        }
        iVar9 = local_d0 - iVar6;
        if (local_dc - iVar6 < local_d0 - iVar6) {
          iVar9 = local_dc - iVar6;
        }
        iVar8 = iVar6 + local_d0;
        if (iVar6 + local_d0 < local_dc + iVar6) {
          iVar8 = local_dc + iVar6;
        }
        Am_Point_List::Start(&local_f0);
        Am_Point_List::Next(&local_f0);
        next_vertex(&local_f0,local_cc,local_dc,&local_100,&local_104,(double *)&local_f8,
                    (double *)&local_d8);
        local_a8 = (double)CONCAT44(local_f8._4_4_,(int)local_f8);
      }
      local_a8 = -local_a8;
      uStack_a0 = 0x8000000000000000;
      local_78 = (double)CONCAT44(local_d8._4_4_,(int)local_d8);
      uStack_70 = 0;
      bVar2 = next_vertex(&local_f0,local_100,local_104,&local_c4,&local_c8,(double *)&local_f8,
                          (double *)&local_d8);
      local_e0 = iVar8;
      if (bVar2) {
        local_68 = (double)iVar5 * 0.5;
        local_bc = iVar5 / 2;
        local_c0 = (int)(short)((iVar5 - (iVar5 + 1 >> 0x1f)) + 1U >> 1);
        dVar11 = local_a8;
        local_a8 = local_78;
        uVar1 = uStack_70;
        do {
          dVar12 = -local_a8;
          local_48 = (double)CONCAT44(local_f8._4_4_,(int)local_f8);
          local_a8 = (double)CONCAT44(local_d8._4_4_,(int)local_d8);
          uStack_40 = 0;
          uStack_a0 = 0;
          local_b8 = iVar7;
          if (ABS(dVar11 * local_48 + dVar12 * local_a8) <= 0.981627183) {
            local_60 = local_68 / (dVar11 * local_a8 - local_48 * dVar12);
            local_78 = dVar12;
            uStack_70 = uVar1 ^ 0x8000000000000000;
            dVar11 = ceil(ABS((dVar11 + local_48) * local_60));
            dVar12 = ceil(ABS((local_78 + local_a8) * local_60));
            iVar6 = local_100 - (int)dVar11;
            iVar5 = local_100 + (int)dVar11;
            iVar7 = local_104 - (int)dVar12;
            iVar8 = local_104 + (int)dVar12;
          }
          else {
            iVar6 = local_100 - local_bc;
            iVar5 = local_100 + local_c0;
            iVar7 = local_104 - local_bc;
            iVar8 = local_104 + local_c0;
          }
          local_100 = local_c4;
          local_104 = local_c8;
          bVar2 = next_vertex(&local_f0,local_c4,local_c8,&local_c4,&local_c8,(double *)&local_f8,
                              (double *)&local_d8);
          if (local_e0 <= iVar8) {
            local_e0 = iVar8;
          }
          if (iVar7 <= iVar9) {
            iVar9 = iVar7;
          }
          iVar7 = local_b8;
          if (local_b8 <= iVar5) {
            iVar7 = iVar5;
          }
          if (iVar6 <= iVar10) {
            iVar10 = iVar6;
          }
          dVar11 = -local_48;
          uVar1 = uStack_a0;
        } while (bVar2);
      }
      Am_Point_List::~Am_Point_List(&local_f0);
      *local_98 = iVar10;
      *local_90 = iVar9;
      *local_88 = (iVar7 - iVar10) + 1;
      *height = (local_e0 - iVar9) + 1;
      goto LAB_0027d127;
    }
  }
  Am_Point_List::Get_Extents(pl,&local_100,&local_104,(int *)&local_f8,(int *)&local_d8);
  uVar4 = (uint)(short)(local_fa - (local_fa >> 0xf));
  iVar5 = (int)uVar4 >> 1;
  uVar4 = uVar4 | 1;
  *local_98 = local_100 - iVar5;
  *local_90 = local_104 - iVar5;
  *local_88 = (uVar4 - local_100) + (int)local_f8;
  *height = (uVar4 - local_104) + (int)local_d8;
LAB_0027d127:
  Am_Image_Array::~Am_Image_Array(&local_80);
  return;
}

Assistant:

void
Am_Drawonable_Impl::Get_Polygon_Bounding_Box(const Am_Point_List &pl,
                                             const Am_Style &ls, int &out_left,
                                             int &out_top, int &width,
                                             int &height)
{
  short thick;
  Am_Line_Cap_Style_Flag cap;
  Am_Join_Style_Flag join;
  Am_Line_Solid_Flag solid;
  const char *dash;
  int dashl;
  Am_Fill_Solid_Flag fill;
  Am_Fill_Poly_Flag poly;
  Am_Image_Array stipple;

  ls.Get_Values(thick, cap, join, solid, dash, dashl, fill, poly, stipple);

  if (thick > 0 && join == Am_JOIN_MITER && pl.Length() > 2) {
    int right, bottom, left, top;
    // slow: does several flops per point to compute the true vertex of
    // the mitered join
    compute_mitered_join_extents(pl, thick, cap, left, top, right, bottom);
    out_left = left;
    out_top = top;
    width = right - left + 1;
    height = bottom - top + 1;
  } else {
    const int th = thick / 2;

    // fast: just four comparisons per point, then adjust thickness
    int right, bottom, left, top;
    pl.Get_Extents(left, top, right, bottom);

    out_left = left - th;
    out_top = top - th;
    width = right - left + 1 + 2 * th;
    height = bottom - top + 1 + 2 * th;
  }
}